

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O0

ion_err_t ion_add_to_master_table
                    (ion_dictionary_t *dictionary,ion_dictionary_size_t dictionary_size)

{
  ion_err_t iVar1;
  undefined1 local_34 [8];
  ion_dictionary_config_info_t config;
  ion_dictionary_size_t dictionary_size_local;
  ion_dictionary_t *dictionary_local;
  
  local_34._0_4_ = dictionary->instance->id;
  local_34[4] = '\0';
  config.id = dictionary->instance->key_type;
  config._4_4_ = (dictionary->instance->record).key_size;
  config.type = (dictionary->instance->record).value_size;
  config.value_size = dictionary->instance->type;
  config.dictionary_size._0_1_ = dictionary->status;
  config.key_size = dictionary_size;
  config.dictionary_type = dictionary_size;
  unique0x100000a1 = dictionary;
  iVar1 = ion_master_table_write((ion_dictionary_config_info_t *)local_34,-2);
  return iVar1;
}

Assistant:

ion_err_t
ion_add_to_master_table(
	ion_dictionary_t		*dictionary,
	ion_dictionary_size_t	dictionary_size
) {
	ion_dictionary_config_info_t config = {
		.id = dictionary->instance->id, .use_type = 0, .type = dictionary->instance->key_type, .key_size = dictionary->instance->record.key_size, .value_size = dictionary->instance->record.value_size, .dictionary_size = dictionary_size, .dictionary_type = dictionary->instance->type, .dictionary_status = dictionary->status
	};

	return ion_master_table_write(&config, ION_MASTER_TABLE_WRITE_FROM_END);
}